

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_write_uint32(void *a,uint32_t *attrib,uint32_t nr_of_attribs,trico_stream_type st)

{
  int iVar1;
  uint uVar2;
  char *dst;
  int iVar3;
  uint uVar4;
  uint64_t sz;
  ulong uVar5;
  uint64_t sz_3;
  uint8_t *b1;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  LZ4_stream_t lz4Stream_body;
  uint8_t *local_4070;
  uint8_t *local_4068;
  uint8_t *local_4060;
  uint8_t *local_4058;
  undefined1 local_4050 [16416];
  
  iVar1 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar3 = 0;
  if (iVar1 != 0) {
    **(undefined1 **)((long)a + 8) = (char)st;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar3 = 0;
    if (iVar1 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_attribs;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      uVar5 = (ulong)nr_of_attribs;
      local_4070 = (uint8_t *)malloc(uVar5);
      local_4058 = (uint8_t *)malloc(uVar5);
      local_4060 = (uint8_t *)malloc(uVar5);
      local_4068 = (uint8_t *)malloc(uVar5);
      trico_transpose_uint32_aos_to_soa
                (&local_4070,&local_4058,&local_4060,&local_4068,attrib,nr_of_attribs);
      LZ4_initStream(local_4050,0x4020);
      iVar3 = 0;
      uVar4 = 0;
      if (nr_of_attribs < 0x7e000001) {
        uVar4 = (uint)(uVar5 * 0x8080808081 >> 0x27) + 0x10;
      }
      dst = (char *)malloc((ulong)uVar4);
      uVar2 = LZ4_compress_default((char *)local_4070,dst,nr_of_attribs,uVar4);
      iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
      if (iVar1 != 0) {
        **(uint **)((long)a + 8) = uVar2;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        uVar5 = (ulong)uVar2;
        iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
        if (iVar1 != 0) {
          memcpy(*(void **)((long)a + 8),dst,uVar5);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
          uVar2 = LZ4_compress_default((char *)local_4058,dst,nr_of_attribs,uVar4);
          iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
          if (iVar1 != 0) {
            **(uint **)((long)a + 8) = uVar2;
            *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
            *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
            uVar5 = (ulong)uVar2;
            iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
            if (iVar1 != 0) {
              memcpy(*(void **)((long)a + 8),dst,uVar5);
              *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
              *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
              uVar2 = LZ4_compress_default((char *)local_4060,dst,nr_of_attribs,uVar4);
              iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
              if (iVar1 != 0) {
                **(uint **)((long)a + 8) = uVar2;
                *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                uVar5 = (ulong)uVar2;
                iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                if (iVar1 != 0) {
                  memcpy(*(void **)((long)a + 8),dst,uVar5);
                  *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                  *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                  uVar4 = LZ4_compress_default((char *)local_4068,dst,nr_of_attribs,uVar4);
                  iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                  if (iVar1 != 0) {
                    **(uint **)((long)a + 8) = uVar4;
                    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                    uVar5 = (ulong)uVar4;
                    iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                    if (iVar1 != 0) {
                      memcpy(*(void **)((long)a + 8),dst,uVar5);
                      *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                      free(dst);
                      free(local_4070);
                      free(local_4058);
                      free(local_4060);
                      free(local_4068);
                      iVar3 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_write_uint32(void* a, const uint32_t* attrib, uint32_t nr_of_attribs, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_attribs);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, attrib, nr_of_attribs);

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  return 1;
  }